

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connect(Curl_easy *data,connectdata **in_connect,_Bool *asyncp,_Bool *protocol_done)

{
  curl_proxytype cVar1;
  uint uVar2;
  bool bVar3;
  _Bool *first;
  _Bool _Var4;
  int iVar5;
  CURLcode CVar6;
  size_t sVar7;
  size_t sVar8;
  connectdata *pcVar9;
  ssl_backend_data *psVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  byte *pbVar14;
  char *pcVar15;
  char **ppcVar16;
  char **ppcVar17;
  ulong uVar18;
  long lVar19;
  connectbundle *bundle;
  connectdata *pcVar20;
  byte bVar21;
  ulong uVar22;
  Curl_handler *pCVar23;
  byte *pbVar24;
  Curl_handler **ppCVar25;
  char *pcVar26;
  char cVar27;
  curltime cVar28;
  _Bool waitpipe;
  _Bool force_reuse;
  char *passwd;
  char *user;
  char *options;
  connectdata *conn_temp;
  char slashbuf [4];
  char protobuf [16];
  _Bool local_ba;
  _Bool local_b9;
  connectdata **local_b8;
  _Bool *local_b0;
  char **local_a8;
  byte *local_a0;
  char **local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  size_t local_78;
  char *local_70;
  size_t local_68;
  connectdata *local_60;
  _Bool *local_58;
  char *local_50;
  _Bool local_48 [24];
  
  *asyncp = false;
  local_60 = (connectdata *)0x0;
  local_88 = (char *)0x0;
  local_90 = (char *)0x0;
  local_80 = (char *)0x0;
  local_b9 = false;
  local_ba = false;
  local_58 = protocol_done;
  sVar7 = Curl_multi_max_host_connections(data->multi);
  sVar8 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  if ((data->change).url == (char *)0x0) {
    CVar6 = CURLE_URL_MALFORMAT;
    in_connect = in_connect;
    goto LAB_0011b053;
  }
  local_78 = sVar7;
  local_68 = sVar8;
  pcVar9 = (connectdata *)(*Curl_ccalloc)(1,0x758);
  local_b8 = in_connect;
  if (pcVar9 == (connectdata *)0x0) {
LAB_0011a9c3:
    pcVar9 = (connectdata *)0x0;
  }
  else {
    sVar7 = Curl_ssl->sizeof_ssl_backend_data;
    psVar10 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar7);
    if (psVar10 == (ssl_backend_data *)0x0) {
      (*Curl_cfree)(pcVar9);
      pcVar9 = (connectdata *)0x0;
      in_connect = local_b8;
    }
    else {
      pcVar9->ssl_extra = psVar10;
      pcVar9->ssl[0].backend = psVar10;
      pcVar9->ssl[1].backend =
           (ssl_backend_data *)((psVar10->tap_state).master_key + (sVar7 - 0x1c));
      pcVar9->proxy_ssl[0].backend =
           (ssl_backend_data *)((psVar10->tap_state).master_key + sVar7 * 2 + -0x1c);
      pcVar9->proxy_ssl[1].backend =
           (ssl_backend_data *)((psVar10->tap_state).master_key + sVar7 * 3 + -0x1c);
      pcVar9->handler = &Curl_handler_dummy;
      pcVar9->connection_id = -1;
      pcVar9->port = -1;
      pcVar9->remote_port = -1;
      pcVar9->sock[0] = -1;
      pcVar9->sock[1] = -1;
      pcVar9->tempsock[0] = -1;
      pcVar9->tempsock[1] = -1;
      Curl_conncontrol(pcVar9,1);
      cVar28 = Curl_now();
      in_connect = local_b8;
      (pcVar9->created).tv_sec = cVar28.tv_sec;
      (pcVar9->created).tv_usec = cVar28.tv_usec;
      pcVar9->data = data;
      cVar1 = (data->set).proxytype;
      (pcVar9->http_proxy).proxytype = cVar1;
      (pcVar9->socks_proxy).proxytype = CURLPROXY_SOCKS4;
      pcVar11 = (data->set).str[0x15];
      if (pcVar11 == (char *)0x0) {
        protocol_done = (_Bool *)0x0;
      }
      else {
        protocol_done = (_Bool *)CONCAT71((int7)((ulong)pcVar11 >> 8),*pcVar11 != '\0');
      }
      _Var4 = SUB81(protocol_done,0);
      (pcVar9->bits).proxy = _Var4;
      (pcVar9->bits).httpproxy = (_Bool)(cVar1 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0) & _Var4);
      (pcVar9->bits).socksproxy = (_Bool)(cVar1 >= (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0) & _Var4);
      pcVar11 = (data->set).str[0x16];
      if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
        (pcVar9->bits).proxy = true;
        (pcVar9->bits).socksproxy = true;
      }
      (pcVar9->bits).proxy_user_passwd = (data->set).str[0x2c] != (char *)0x0;
      (pcVar9->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
      (pcVar9->bits).user_passwd = (data->set).str[0x29] != (char *)0x0;
      (pcVar9->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
      (pcVar9->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
      (pcVar9->ssl_config).verifystatus = (data->set).ssl.primary.verifystatus;
      (pcVar9->ssl_config).verifypeer = (data->set).ssl.primary.verifypeer;
      (pcVar9->ssl_config).verifyhost = (data->set).ssl.primary.verifyhost;
      (pcVar9->proxy_ssl_config).verifystatus = (data->set).proxy_ssl.primary.verifystatus;
      (pcVar9->proxy_ssl_config).verifypeer = (data->set).proxy_ssl.primary.verifypeer;
      (pcVar9->proxy_ssl_config).verifyhost = (data->set).proxy_ssl.primary.verifyhost;
      pcVar9->ip_version = (data->set).ipver;
      _Var4 = Curl_pipeline_wanted(data->multi,1);
      if ((_Var4) && (pcVar9->master_buffer == (char *)0x0)) {
        pcVar11 = (char *)(*Curl_ccalloc)(0x4000,1);
        pcVar9->master_buffer = pcVar11;
        if (pcVar11 != (char *)0x0) goto LAB_0011a8f7;
LAB_0011a97d:
        Curl_llist_destroy(&pcVar9->send_pipe,(void *)0x0);
        Curl_llist_destroy(&pcVar9->recv_pipe,(void *)0x0);
        (*Curl_cfree)(pcVar9->master_buffer);
        (*Curl_cfree)(pcVar9->localdev);
        (*Curl_cfree)(pcVar9->ssl_extra);
        (*Curl_cfree)(pcVar9);
        goto LAB_0011a9c3;
      }
LAB_0011a8f7:
      Curl_llist_init(&pcVar9->send_pipe,llist_dtor);
      in_connect = local_b8;
      Curl_llist_init(&pcVar9->recv_pipe,llist_dtor);
      pcVar11 = (data->set).str[8];
      if (pcVar11 != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pcVar11);
        pcVar9->localdev = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_0011a97d;
      }
      pcVar9->localportrange = (data->set).localportrange;
      pcVar9->localport = (data->set).localport;
      pcVar9->fclosesocket = (data->set).fclosesocket;
      pcVar9->closesocket_client = (data->set).closesocket_client;
    }
  }
  if (pcVar9 == (connectdata *)0x0) {
LAB_0011b04e:
    CVar6 = CURLE_OUT_OF_MEMORY;
    goto LAB_0011b053;
  }
  *in_connect = pcVar9;
  sVar12 = strlen((data->change).url);
  sVar13 = 0x100;
  if (0x100 < sVar12) {
    sVar13 = sVar12;
  }
  (*Curl_cfree)((data->state).pathbuffer);
  (data->state).pathbuffer = (char *)0x0;
  (data->state).path = (char *)0x0;
  pcVar11 = (char *)(*Curl_cmalloc)(sVar13 + 2);
  (data->state).pathbuffer = pcVar11;
  if (pcVar11 != (char *)0x0) {
    (data->state).path = pcVar11;
    pcVar11 = (char *)(*Curl_cmalloc)(sVar13 + 2);
    (pcVar9->host).rawalloc = pcVar11;
    if (pcVar11 == (char *)0x0) {
      (*Curl_cfree)((data->state).pathbuffer);
      (data->state).pathbuffer = (char *)0x0;
      (data->state).path = (char *)0x0;
    }
    else {
      (pcVar9->host).name = pcVar11;
      *pcVar11 = '\0';
      local_88 = (*Curl_cstrdup)("");
      local_90 = (*Curl_cstrdup)("");
      local_80 = (*Curl_cstrdup)("");
      ppcVar17 = (char **)CONCAT71((int7)((ulong)protocol_done >> 8),local_88 != (char *)0x0);
      if (local_80 != (char *)0x0 && (local_90 != (char *)0x0 && local_88 != (char *)0x0)) {
        local_b0 = (_Bool *)0x15563c;
        ppcVar16 = (char **)(data->state).path;
        pbVar14 = (byte *)(data->change).url;
        pcVar11 = strpbrk((char *)pbVar14,"\r\n");
        if (pcVar11 == (char *)0x0) {
          local_98 = ppcVar16;
          if (*pbVar14 == 0x3a) {
            pcVar11 = "Bad URL, colon is first character";
            goto LAB_0011ae56;
          }
          if (((((byte)((*pbVar14 & 0xdf) + 0xbf) < 0x1a) && (pbVar14[1] == 0x3a)) &&
              (pcVar11 = (data->set).str[7], pcVar11 != (char *)0x0)) &&
             (iVar5 = Curl_strcasecompare(pcVar11,"file"), iVar5 != 0)) {
            uVar18 = 0;
          }
          else {
            ppcVar17 = (char **)0x0;
            uVar18 = 0;
            do {
              bVar21 = *(byte *)((long)ppcVar17 + (long)(data->change).url);
              if ((bVar21 == 0) || (bVar21 == 0x2f)) goto LAB_0011ab84;
              if (bVar21 == 0x3a) {
                uVar18 = 1;
                goto LAB_0011ab84;
              }
              ppcVar17 = (char **)((long)ppcVar17 + 1);
            } while (ppcVar17 != (char **)0x10);
            uVar18 = 0;
          }
LAB_0011ab84:
          pcVar11 = (char *)local_98;
          cVar27 = (char)uVar18;
          if (cVar27 == '\0') {
LAB_0011abaf:
            pcVar26 = (data->set).str[7];
            if ((pcVar26 == (char *)0x0) ||
               (iVar5 = Curl_strcasecompare(pcVar26,"file"), iVar5 == 0)) goto LAB_0011ac3a;
LAB_0011abcc:
            pcVar26 = "%[^\n]";
            if (cVar27 != '\0') {
              pcVar26 = "%*15[^\n/:]:%[^\n]";
            }
            iVar5 = __isoc99_sscanf((data->change).url,pcVar26,pcVar11);
            if (iVar5 != 1) {
              pcVar11 = "Bad URL";
              goto LAB_0011ae56;
            }
            if (cVar27 != '\0') {
              if ((((*pcVar11 == 0x2f) && (*(byte *)((long)pcVar11 + 1) == 0x2f)) &&
                  (*(byte *)((long)pcVar11 + 2) == 0x2f)) && (*(byte *)((long)pcVar11 + 3) == 0x2f))
              {
                pcVar11 = "SMB shares are not supported in file: URLs.";
                goto LAB_0011ae56;
              }
              ppcVar17 = (char **)0x0;
              if ((cVar27 == '\x01' && *pcVar11 == 0x2f) && (*(byte *)((long)pcVar11 + 1) == 0x2f))
              {
                local_b0 = (_Bool *)CONCAT44(local_b0._4_4_,(int)uVar18);
                pbVar14 = (byte *)((long)pcVar11 + 2);
                if ((*(byte *)((long)pcVar11 + 2) != 0x2f) &&
                   (((0x19 < (byte)((*(byte *)((long)pcVar11 + 2) & 0xdf) + 0xbf) ||
                     ((*(byte *)((long)pcVar11 + 3) != 0x7c &&
                      (*(byte *)((long)pcVar11 + 3) != 0x3a)))) ||
                    ((bVar21 = *(byte *)((long)pcVar11 + 4), bVar21 != 0 &&
                     ((bVar21 != 0x2f && (pcVar11 = (char *)local_98, bVar21 != 0x5c)))))))) {
                  iVar5 = curl_strnequal("localhost/",(char *)pbVar14,10);
                  if ((iVar5 == 0) &&
                     (iVar5 = curl_strnequal("127.0.0.1/",(char *)pbVar14,10), iVar5 == 0)) {
                    pcVar11 = "Invalid file://hostname/, expected localhost or 127.0.0.1 or none";
                    goto LAB_0011ae56;
                  }
                  pbVar14 = (byte *)((long)pcVar11 + 0xb);
                }
                pbVar24 = pbVar14 + 1;
                if (pbVar14[1] != 0x2f) {
                  pbVar24 = pbVar14;
                }
                sVar13 = strlen((char *)pbVar24);
                pcVar11 = (char *)local_98;
                memmove(local_98,pbVar24,sVar13 + 1);
                uVar18 = (ulong)local_b0 & 0xffffffff;
              }
            }
            if ((*pcVar11 == 0x2f) &&
               (uVar22 = CONCAT71((int7)((ulong)ppcVar17 >> 8),*(byte *)((long)pcVar11 + 1)) &
                         0xffffffffffffffdf, bVar21 = (char)uVar22 + 0xbf,
               ppcVar17 = (char **)CONCAT71((int7)(uVar22 >> 8),bVar21), bVar21 < 0x1a)) {
              ppcVar17 = (char **)0x0;
              if ((*(byte *)((long)pcVar11 + 2) != 0x7c) && (*(byte *)((long)pcVar11 + 2) != 0x3a))
              goto LAB_0011ae1b;
              bVar21 = *(byte *)((long)pcVar11 + 3);
              ppcVar17 = (char **)0x0;
              if (((bVar21 != 0) && (bVar21 != 0x2f)) && (bVar21 != 0x5c)) goto LAB_0011ae1b;
LAB_0011ae4f:
              pcVar11 = "File drive letters are only accepted in MSDOS/Windows.";
              goto LAB_0011ae56;
            }
LAB_0011ae1b:
            if (((byte)((*pcVar11 & 0xdfU) + 0xbf) < 0x1a) &&
               (((*(byte *)((long)pcVar11 + 1) == 0x7c || (*(byte *)((long)pcVar11 + 1) == 0x3a)) &&
                ((bVar21 = *(byte *)((long)pcVar11 + 2), bVar21 == 0 ||
                 ((bVar21 == 0x5c || (bVar21 == 0x2f)))))))) goto LAB_0011ae4f;
            uVar18 = uVar18 ^ 1;
            CVar6 = CURLE_URL_MALFORMAT;
            local_b0 = (_Bool *)0x15176d;
LAB_0011b0f2:
            pcVar11 = (pcVar9->host).name;
            pcVar15 = strchr(pcVar11,0x40);
            pcVar26 = pcVar15 + 1;
            if (pcVar15 == (char *)0x0) {
              pcVar26 = pcVar11;
            }
            pbVar14 = (byte *)strchr(pcVar26,0x3f);
            if (pbVar14 == (byte *)0x0) {
              ppcVar16 = local_98;
              if (*(byte *)local_98 == 0) {
                *(undefined2 *)local_98 = 0x2f;
                goto LAB_0011b175;
              }
              uVar22 = 0;
            }
            else {
              local_a0 = pbVar14;
              local_a8 = (char **)strlen((char *)pbVar14);
              ppcVar16 = local_98;
              sVar13 = strlen((char *)local_98);
              ppcVar17 = local_a8;
              memmove((byte *)((long)ppcVar16 + (long)local_a8) + 1,ppcVar16,sVar13 + 1);
              memcpy((byte *)((long)ppcVar16 + 1),local_a0,(size_t)local_a8);
              *(byte *)ppcVar16 = 0x2f;
              *local_a0 = 0;
LAB_0011b175:
              uVar22 = CONCAT71((int7)((ulong)ppcVar17 >> 8),1);
            }
            ppcVar17 = local_98;
            if (*(byte *)ppcVar16 == 0x2f) {
              if ((data->set).path_as_is == false) {
                local_a0 = (byte *)CONCAT44(local_a0._4_4_,(int)uVar22);
                ppcVar16 = (char **)Curl_dedotdotify((char *)local_98);
                if (ppcVar16 == (char **)0x0) {
                  CVar6 = CURLE_OUT_OF_MEMORY;
                  uVar22 = (ulong)local_a0 & 0xffffffff;
                }
                else {
                  local_a8 = ppcVar16;
                  iVar5 = strcmp((char *)ppcVar16,(char *)ppcVar17);
                  ppcVar16 = local_a8;
                  if (iVar5 == 0) {
                    (*Curl_cfree)(local_a8);
                    uVar22 = (ulong)local_a0 & 0xffffffff;
                  }
                  else {
                    (*Curl_cfree)((data->state).pathbuffer);
                    (data->state).pathbuffer = (char *)local_a8;
                    (data->state).path = (char *)local_a8;
                    uVar22 = 1;
                    local_98 = local_a8;
                    ppcVar16 = local_a8;
                  }
                }
                if (ppcVar16 == (char **)0x0) goto LAB_0011ae68;
              }
            }
            else {
              local_a0 = (byte *)((long)ppcVar16 + 1);
              sVar13 = strlen((char *)ppcVar16);
              memmove(local_a0,ppcVar16,sVar13 + 1);
              *(byte *)ppcVar16 = 0x2f;
              uVar22 = 1;
            }
            if ((char)uVar22 != '\0') {
              local_a0 = (byte *)strlen((char *)local_98);
              ppcVar17 = (char **)strlen((pcVar9->host).name);
              first = local_b0;
              if ((char)uVar18 == '\0') {
                local_a8 = ppcVar17;
                local_70 = (char *)strlen(local_b0);
                iVar5 = curl_strnequal(first,(data->change).url,(size_t)local_70);
                if (iVar5 == 0) {
LAB_0011b3f8:
                  bVar3 = false;
                  Curl_failf(data,"<url> malformed");
                  CVar6 = CURLE_URL_MALFORMAT;
                  ppcVar17 = local_a8;
                }
                else {
                  ppcVar17 = (char **)((long)local_a8 + (long)local_70);
                  iVar5 = curl_strnequal("://",(data->change).url + (long)local_70,3);
                  if (iVar5 == 0) {
                    local_a8 = ppcVar17;
                    iVar5 = curl_strnequal("file:",(data->change).url,5);
                    if (iVar5 == 0) goto LAB_0011b3f8;
                    ppcVar17 = (char **)((long)local_a8 + (ulong)((data->change).url[5] == '/') + 1)
                    ;
                  }
                  else {
                    ppcVar17 = (char **)((long)ppcVar17 + 3);
                  }
                  bVar3 = true;
                }
                if (bVar3) goto LAB_0011b422;
LAB_0011b4e3:
                bVar3 = false;
              }
              else {
LAB_0011b422:
                pbVar14 = local_a0;
                local_a8 = ppcVar17;
                pcVar11 = (char *)(*Curl_cmalloc)((size_t)((byte *)((long)ppcVar17 + (long)local_a0)
                                                          + 1));
                if (pcVar11 == (char *)0x0) {
                  CVar6 = CURLE_OUT_OF_MEMORY;
                  goto LAB_0011b4e3;
                }
                local_a0 = pbVar14 + 1;
                memcpy(pcVar11,(data->change).url,(size_t)local_a8);
                local_70 = pcVar11;
                memcpy(pcVar11 + (long)local_a8,local_98,(size_t)local_a0);
                if ((data->change).url_alloc == true) {
                  (*Curl_cfree)((data->change).url);
                  (data->change).url = (char *)0x0;
                  (data->change).url_alloc = false;
                }
                pcVar11 = local_70;
                Curl_infof(data,"Rebuilt URL to: %s\n",local_70);
                (data->change).url = pcVar11;
                (data->change).url_alloc = true;
                bVar3 = true;
              }
              if (!bVar3) goto LAB_0011ae68;
            }
            pCVar23 = &Curl_handler_http;
            ppCVar25 = protocols;
            do {
              ppCVar25 = ppCVar25 + 1;
              iVar5 = Curl_strcasecompare(pCVar23->scheme,local_b0);
              if (iVar5 != 0) {
                if ((((uint)(data->set).allowed_protocols & pCVar23->protocol) != 0) &&
                   (((data->state).this_is_a_follow != true ||
                    (((uint)(data->set).redir_protocols & pCVar23->protocol) != 0)))) {
                  pcVar9->given = pCVar23;
                  pcVar9->handler = pCVar23;
                  CVar6 = CURLE_OK;
                  bVar3 = true;
                  goto LAB_0011b571;
                }
                break;
              }
              pCVar23 = *ppCVar25;
            } while (pCVar23 != (Curl_handler *)0x0);
            bVar3 = false;
            Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",local_b0);
            CVar6 = CURLE_UNSUPPORTED_PROTOCOL;
LAB_0011b571:
            if ((bVar3) &&
               (CVar6 = parse_url_login(data,pcVar9,&local_88,&local_90,&local_80),
               CVar6 == CURLE_OK)) {
              local_b0 = (_Bool *)CONCAT44(local_b0._4_4_,(int)uVar18);
              pcVar11 = (pcVar9->host).name;
              if ((*pcVar11 == '[') && (pcVar11 = strchr(pcVar11,0x25), pcVar11 != (char *)0x0)) {
                lVar19 = 3;
                iVar5 = strncmp("%25",pcVar11,3);
                if (iVar5 != 0) {
                  Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                  lVar19 = 1;
                }
                uVar18 = strtoul(pcVar11 + lVar19,&local_50,10);
                if (*local_50 == ']') {
                  sVar13 = strlen(local_50);
                  memmove(pcVar11,local_50,sVar13 + 1);
                  pcVar9->scope_id = (uint)uVar18;
                }
                else {
                  Curl_infof(data,"Invalid IPv6 address format\n");
                }
              }
              uVar2 = (data->set).scope_id;
              if (uVar2 != 0) {
                pcVar9->scope_id = uVar2;
              }
              pcVar11 = strchr((char *)local_98,0x23);
              uVar18 = (ulong)local_b0 & 0xffffffff;
              CVar6 = CURLE_OK;
              if (pcVar11 != (char *)0x0) {
                *pcVar11 = '\0';
                pcVar11 = strchr((data->change).url,0x23);
                CVar6 = CURLE_OK;
                if (pcVar11 != (char *)0x0) {
                  *pcVar11 = '\0';
                }
              }
            }
          }
          else {
            iVar5 = Curl_strncasecompare((data->change).url,"file:",5);
            if (iVar5 != 0) goto LAB_0011abcc;
            if (cVar27 == '\0') goto LAB_0011abaf;
LAB_0011ac3a:
            *pcVar11 = 0;
            ppcVar17 = &local_50;
            iVar5 = __isoc99_sscanf((data->change).url,"%15[^\n/:]:%3[/]%[^\n/?#]%[^\n]",local_48,
                                    ppcVar17,(pcVar9->host).name,pcVar11);
            if (iVar5 == 2) {
              pcVar26 = "Bad URL";
LAB_0011ac7a:
              Curl_failf(data,pcVar26);
              CVar6 = CURLE_URL_MALFORMAT;
LAB_0011ac8c:
              uVar18 = 0;
              bVar3 = false;
            }
            else if (iVar5 < 3) {
              iVar5 = __isoc99_sscanf((data->change).url,"%[^\n/?#]%[^\n]",(pcVar9->host).name);
              if (iVar5 < 1) {
                pcVar26 = "<url> malformed";
                ppcVar17 = (char **)pcVar11;
                goto LAB_0011ac7a;
              }
              local_b0 = (_Bool *)(data->set).str[7];
              CVar6 = CURLE_OUT_OF_MEMORY;
              if (local_b0 == (_Bool *)0x0) {
                iVar5 = curl_strnequal("FTP.",(pcVar9->host).name,4);
                if (iVar5 == 0) {
                  iVar5 = curl_strnequal("DICT.",(pcVar9->host).name,5);
                  if (iVar5 == 0) {
                    iVar5 = curl_strnequal("LDAP.",(pcVar9->host).name,5);
                    if (iVar5 == 0) {
                      iVar5 = curl_strnequal("IMAP.",(pcVar9->host).name,5);
                      if (iVar5 == 0) {
                        iVar5 = curl_strnequal("SMTP.",(pcVar9->host).name,5);
                        if (iVar5 == 0) {
                          iVar5 = curl_strnequal("POP3.",(pcVar9->host).name,5);
                          pcVar11 = "pop3";
                          local_b0 = (_Bool *)pcVar11;
                          if (iVar5 == 0) {
                            pcVar11 = "http";
                            local_b0 = (_Bool *)pcVar11;
                          }
                        }
                        else {
                          local_b0 = (_Bool *)0x14f30f;
                        }
                      }
                      else {
                        local_b0 = (_Bool *)0x14f304;
                      }
                    }
                    else {
                      local_b0 = (_Bool *)0x14f2f9;
                    }
                  }
                  else {
                    local_b0 = (_Bool *)0x14f2ee;
                  }
                }
                else {
                  local_b0 = (_Bool *)0x14fabd;
                }
              }
              uVar18 = CONCAT71((int7)((ulong)local_48 >> 8),1);
              bVar3 = true;
              ppcVar17 = (char **)pcVar11;
            }
            else {
              sVar13 = strlen((char *)&local_50);
              CVar6 = CURLE_OUT_OF_MEMORY;
              bVar3 = true;
              if (sVar13 == 2) {
                uVar18 = 0;
                local_b0 = local_48;
              }
              else {
                pcVar11 = "";
                if (1 < sVar13) {
                  pcVar11 = "es";
                }
                Curl_infof(data,"Unwillingly accepted illegal URL using %d slash%s!\n",sVar13,
                           pcVar11);
                if ((data->change).url_alloc == true) {
                  (*Curl_cfree)((data->change).url);
                }
                local_b0 = local_48;
                ppcVar17 = local_98;
                pcVar11 = curl_maprintf("%s://%s%s",local_b0,(pcVar9->host).name);
                (data->change).url = pcVar11;
                if (pcVar11 == (char *)0x0) goto LAB_0011ac8c;
                (data->change).url_alloc = true;
                uVar18 = 0;
              }
            }
            if (bVar3) goto LAB_0011b0f2;
          }
        }
        else {
          pcVar11 = "Illegal characters found in URL";
LAB_0011ae56:
          uVar18 = 0;
          Curl_failf(data,pcVar11);
          CVar6 = CURLE_URL_MALFORMAT;
        }
LAB_0011ae68:
        in_connect = local_b8;
        if (CVar6 != CURLE_OK) goto LAB_0011b053;
        if ((char)uVar18 != '\0') {
          pbVar14 = (byte *)curl_maprintf("%s://%s",pcVar9->handler->scheme,(data->change).url);
          if (pbVar14 == (byte *)0x0) {
            CVar6 = CURLE_OUT_OF_MEMORY;
          }
          else {
            bVar21 = *pbVar14;
            pbVar24 = pbVar14;
            while (bVar21 != 0x3a) {
              iVar5 = tolower((uint)bVar21);
              *pbVar24 = (byte)iVar5;
              bVar21 = pbVar24[1];
              pbVar24 = pbVar24 + 1;
            }
            if ((data->change).url_alloc == true) {
              (*Curl_cfree)((data->change).url);
              (data->change).url = (char *)0x0;
              (data->change).url_alloc = false;
            }
            (data->change).url = (char *)pbVar14;
            (data->change).url_alloc = true;
            CVar6 = CURLE_OK;
          }
          in_connect = local_b8;
          if (pbVar14 == (byte *)0x0) goto LAB_0011b053;
        }
        in_connect = local_b8;
        if (((pcVar9->given->flags & 0x40) != 0) &&
           (pcVar11 = strchr((pcVar9->data->state).path,0x3f), pcVar11 != (char *)0x0)) {
          *pcVar11 = '\0';
        }
        pcVar11 = (data->set).str[0x35];
        if (pcVar11 != (char *)0x0) {
          pcVar11 = (*Curl_cstrdup)(pcVar11);
          pcVar9->oauth_bearer = pcVar11;
          if (pcVar11 == (char *)0x0) goto LAB_0011b04e;
        }
        pcVar11 = (data->set).str[0x36];
        if (pcVar11 != (char *)0x0) {
          pcVar11 = (*Curl_cstrdup)(pcVar11);
          pcVar9->unix_domain_socket = pcVar11;
          if (pcVar11 == (char *)0x0) goto LAB_0011b04e;
          pcVar9->abstract_unix_socket = (data->set).abstract_unix_socket;
        }
        CVar6 = create_conn_helper_init_proxy(pcVar9);
        if (CVar6 != CURLE_OK) goto LAB_0011b053;
        if (((pcVar9->given->flags & 1) != 0) && ((pcVar9->bits).httpproxy == true)) {
          (pcVar9->bits).tunnel_proxy = true;
        }
        CVar6 = parse_remote_port(data,pcVar9);
        if (((((((CVar6 != CURLE_OK) ||
                (CVar6 = override_login(data,pcVar9,&local_88,&local_90,&local_80),
                CVar6 != CURLE_OK)) ||
               (CVar6 = set_login(pcVar9,local_88,local_90,local_80), CVar6 != CURLE_OK)) ||
              ((CVar6 = parse_connect_to_slist(data,pcVar9,(data->set).connect_to),
               CVar6 != CURLE_OK || (CVar6 = fix_hostname(pcVar9,&pcVar9->host), CVar6 != CURLE_OK))
              )) || (((pcVar9->bits).conn_to_host == true &&
                     (CVar6 = fix_hostname(pcVar9,&pcVar9->conn_to_host), in_connect = local_b8,
                     CVar6 != CURLE_OK)))) ||
            (((pcVar9->bits).httpproxy == true &&
             (CVar6 = fix_hostname(pcVar9,&(pcVar9->http_proxy).host), in_connect = local_b8,
             CVar6 != CURLE_OK)))) ||
           (((pcVar9->bits).socksproxy == true &&
            (CVar6 = fix_hostname(pcVar9,&(pcVar9->socks_proxy).host), in_connect = local_b8,
            CVar6 != CURLE_OK)))) goto LAB_0011b053;
        if (((pcVar9->bits).conn_to_host == true) &&
           (iVar5 = Curl_strcasecompare((pcVar9->conn_to_host).name,(pcVar9->host).name), iVar5 != 0
           )) {
          (pcVar9->bits).conn_to_host = false;
        }
        if (((pcVar9->bits).conn_to_port == true) && (pcVar9->conn_to_port == pcVar9->remote_port))
        {
          (pcVar9->bits).conn_to_port = false;
        }
        if ((((pcVar9->bits).conn_to_host != false) || ((pcVar9->bits).conn_to_port == true)) &&
           ((pcVar9->bits).httpproxy == true)) {
          (pcVar9->bits).tunnel_proxy = true;
        }
        CVar6 = setup_connection_internals(pcVar9);
        in_connect = local_b8;
        if (CVar6 != CURLE_OK) goto LAB_0011b053;
        pcVar9->recv[0] = Curl_recv_plain;
        pcVar9->send[0] = Curl_send_plain;
        pcVar9->recv[1] = Curl_recv_plain;
        pcVar9->send[1] = Curl_send_plain;
        (pcVar9->bits).tcp_fastopen = (data->set).tcp_fastopen;
        if ((pcVar9->handler->flags & 0x10) != 0) {
          CVar6 = (*pcVar9->handler->connect_it)(pcVar9,local_48);
          if (CVar6 == CURLE_OK) {
            pcVar9->data = data;
            (pcVar9->bits).tcpconnect[0] = true;
            Curl_conncache_add_conn((data->state).conn_cache,pcVar9);
            CVar6 = setup_range(data);
            if (CVar6 != CURLE_OK) {
              (*pcVar9->handler->done)(pcVar9,CVar6,false);
              in_connect = local_b8;
              goto LAB_0011b053;
            }
            CVar6 = CURLE_OK;
            Curl_setup_transfer(pcVar9,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
          }
          Curl_init_do(data,pcVar9);
          in_connect = local_b8;
          goto LAB_0011b053;
        }
        pcVar11 = (data->set).str[0x1b];
        (data->set).ssl.primary.CApath = (data->set).str[0x1a];
        (data->set).proxy_ssl.primary.CApath = pcVar11;
        (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
        (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
        pcVar11 = (data->set).str[0x23];
        (data->set).ssl.primary.random_file = pcVar11;
        (data->set).proxy_ssl.primary.random_file = pcVar11;
        pcVar11 = (data->set).str[0x22];
        (data->set).ssl.primary.egdsocket = pcVar11;
        (data->set).proxy_ssl.primary.egdsocket = pcVar11;
        (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
        (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
        (data->set).ssl.CRLfile = (data->set).str[0x25];
        (data->set).proxy_ssl.CRLfile = (data->set).str[0x26];
        (data->set).ssl.issuercert = (data->set).str[0x27];
        (data->set).proxy_ssl.issuercert = (data->set).str[0x28];
        pcVar11 = (data->set).str[0];
        pcVar26 = (data->set).str[1];
        (data->set).ssl.cert = pcVar11;
        (data->set).proxy_ssl.cert = pcVar26;
        (data->set).ssl.cert_type = (data->set).str[2];
        (data->set).proxy_ssl.cert_type = (data->set).str[3];
        (data->set).ssl.key = (data->set).str[0xd];
        (data->set).proxy_ssl.key = (data->set).str[0xe];
        (data->set).ssl.key_type = (data->set).str[0x11];
        (data->set).proxy_ssl.key_type = (data->set).str[0x12];
        pcVar15 = (data->set).str[0x10];
        (data->set).ssl.key_passwd = (data->set).str[0xf];
        (data->set).proxy_ssl.key_passwd = pcVar15;
        (data->set).ssl.primary.clientcert = pcVar11;
        (data->set).proxy_ssl.primary.clientcert = pcVar26;
        _Var4 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,&pcVar9->ssl_config);
        if (!_Var4) goto LAB_0011aaf3;
        _Var4 = Curl_clone_primary_ssl_config
                          (&(data->set).proxy_ssl.primary,&pcVar9->proxy_ssl_config);
        CVar6 = CURLE_OUT_OF_MEMORY;
        in_connect = local_b8;
        if (!_Var4) goto LAB_0011b053;
        prune_dead_connections(data);
        if (((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)) {
          _Var4 = false;
        }
        else {
          _Var4 = ConnectionExists(data,pcVar9,&local_60,&local_b9,&local_ba);
        }
        pcVar20 = local_60;
        if (((_Var4 != false) && (local_b9 == false)) &&
           ((iVar5 = IsPipeliningPossible(data,local_60), iVar5 != 0 &&
            ((pcVar20->recv_pipe).size + (pcVar20->send_pipe).size != 0)))) {
          Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
                     pcVar20->connection_id);
          sVar7 = Curl_conncache_bundle_size(pcVar20);
          if ((sVar7 < local_78) && (sVar7 = Curl_conncache_size(data), sVar7 < local_68)) {
            _Var4 = false;
            Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
            Curl_conncache_return_conn(pcVar20);
          }
        }
        pcVar20 = local_60;
        if (_Var4 == false) {
          if ((pcVar9->handler->flags & 0x100) != 0) {
            if ((data->set).ssl_enable_alpn == true) {
              (pcVar9->bits).tls_enable_alpn = true;
            }
            if ((data->set).ssl_enable_npn == true) {
              (pcVar9->bits).tls_enable_npn = true;
            }
          }
          if (local_ba == false) {
            bundle = Curl_conncache_find_bundle(pcVar9,(data->state).conn_cache);
            if ((bundle == (connectbundle *)0x0 || local_78 == 0) ||
               (bundle->num_connections < local_78)) {
              Curl_conncache_unlock(pcVar9);
            }
            else {
              pcVar20 = Curl_conncache_extract_bundle(data,bundle);
              Curl_conncache_unlock(pcVar9);
              if (pcVar20 == (connectdata *)0x0) {
                bVar3 = false;
                Curl_infof(data,"No more connections allowed to host: %d\n",local_78);
                goto LAB_0011bcfd;
              }
              pcVar20->data = data;
              Curl_disconnect(pcVar20,false);
            }
            bVar3 = true;
          }
          else {
            bVar3 = false;
          }
LAB_0011bcfd:
          if (((bool)(local_68 != 0 & bVar3)) &&
             (sVar7 = Curl_conncache_size(data), local_68 <= sVar7)) {
            pcVar20 = Curl_conncache_extract_oldest(data);
            if (pcVar20 == (connectdata *)0x0) {
              bVar3 = false;
              Curl_infof(data,"No connections available in cache\n");
            }
            else {
              pcVar20->data = data;
              Curl_disconnect(pcVar20,false);
            }
          }
          if (!bVar3) {
            Curl_infof(data,"No connections available.\n");
            conn_free(pcVar9);
            *local_b8 = (connectdata *)0x0;
            CVar6 = CURLE_NO_CONNECTION_AVAILABLE;
            in_connect = local_b8;
            goto LAB_0011b053;
          }
          pcVar9->inuse = true;
          Curl_conncache_add_conn((data->state).conn_cache,pcVar9);
          if ((((data->state).authhost.picked & 0x28) != 0) && ((data->state).authhost.done == true)
             ) {
            Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
            (data->state).authhost.picked = 0;
            (data->state).authhost.done = false;
          }
          if ((((data->state).authproxy.picked & 0x28) != 0) &&
             ((data->state).authproxy.done == true)) {
            Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
            (data->state).authproxy.picked = 0;
            (data->state).authproxy.done = false;
          }
        }
        else {
          reuse_conn(pcVar9,local_60);
          (*Curl_cfree)(pcVar9->ssl_extra);
          (*Curl_cfree)(pcVar9);
          *local_b8 = pcVar20;
          pcVar11 = "host";
          if ((pcVar20->bits).proxy != false) {
            pcVar11 = "proxy";
          }
          lVar19 = 0x128;
          if (((pcVar20->socks_proxy).host.name == (char *)0x0) &&
             (lVar19 = 0x168, (pcVar20->http_proxy).host.name == (char *)0x0)) {
            lVar19 = 0xe0;
          }
          Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",pcVar20->connection_id
                     ,pcVar11,*(undefined8 *)((pcVar20->chunk).hexbuffer + lVar19 + -0x20));
          pcVar9 = pcVar20;
        }
        Curl_init_do(data,pcVar9);
        CVar6 = setup_range(data);
        in_connect = local_b8;
        if (CVar6 == CURLE_OK) {
          pcVar9->seek_func = (data->set).seek_func;
          pcVar9->seek_client = (data->set).seek_client;
          CVar6 = resolve_server(data,pcVar9,asyncp);
          in_connect = local_b8;
        }
        goto LAB_0011b053;
      }
    }
  }
LAB_0011aaf3:
  CVar6 = CURLE_OUT_OF_MEMORY;
  in_connect = local_b8;
LAB_0011b053:
  (*Curl_cfree)(local_80);
  (*Curl_cfree)(local_90);
  (*Curl_cfree)(local_88);
  if (CVar6 == CURLE_OK) {
    pcVar9 = *in_connect;
    if (((pcVar9->send_pipe).size == 0) && ((pcVar9->recv_pipe).size == 0)) {
      CVar6 = CURLE_OK;
      if (*asyncp == false) {
        CVar6 = Curl_setup_conn(pcVar9,local_58);
      }
    }
    else {
      *local_58 = true;
      CVar6 = CURLE_OK;
    }
  }
  if (CVar6 != CURLE_OK) {
    if (CVar6 != CURLE_NO_CONNECTION_AVAILABLE) {
      if (*in_connect == (connectdata *)0x0) {
        return CVar6;
      }
      Curl_disconnect(*in_connect,false);
    }
    *in_connect = (connectdata *)0x0;
  }
  return CVar6;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  result = create_conn(data, in_connect, asyncp);

  if(!result) {
    /* no error */
    if((*in_connect)->send_pipe.size || (*in_connect)->recv_pipe.size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return result;
  }

  if(result && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return result;
}